

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTemplate.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckTemplate(Parser *this,char *regEx)

{
  undefined1 uVar1;
  byte bVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar4;
  ulong uVar5;
  char *in_RSI;
  long in_RDI;
  Error error;
  string currentWord;
  int level;
  bool afterEqual;
  bool inWord;
  long i;
  long p;
  long sup;
  long inf;
  bool valid;
  long templatePos;
  bool hasErrors;
  RegularExpression regex;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  RegularExpression *in_stack_fffffffffffffc30;
  value_type *in_stack_fffffffffffffc38;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  undefined1 withoutComments;
  size_t in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  string local_330 [32];
  string local_310 [32];
  size_t local_2f0;
  size_t local_2e8;
  undefined8 local_2e0;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  int local_290;
  byte local_28a;
  byte local_289;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  byte local_251;
  long local_250;
  byte local_241;
  char *local_10;
  
  *(undefined1 *)(in_RDI + 0x46) = 1;
  local_10 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x318),"Template should match the regex: ");
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x318),local_10);
  kwssys::RegularExpression::RegularExpression
            (in_stack_fffffffffffffc30,
             (char *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
  local_241 = 0;
  local_250 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e58b0);
  do {
    if (local_250 == -1) {
      bVar2 = local_241 ^ 0xff;
      kwssys::RegularExpression::~RegularExpression(in_stack_fffffffffffffc30);
      return (bool)(bVar2 & 1);
    }
    local_251 = 1;
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
    if ((*pcVar3 == ' ') ||
       (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 == '\n')) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
      if ((*pcVar3 != ' ') &&
         (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 != '\n')) {
        local_251 = 0;
      }
    }
    else {
      local_251 = 0;
    }
    local_270 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5c08);
    local_278 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e512a);
    if ((local_270 == -1) || (local_278 == -1)) {
      local_251 = 0;
    }
    else {
      for (local_280 = local_250 + 8; local_280 < local_270; local_280 = local_280 + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if (((*pcVar3 != ' ') &&
            (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 != '\n')) &&
           (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 != '\r')) {
          local_251 = 0;
          break;
        }
      }
    }
    if ((local_251 & 1) == 0) {
      local_250 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e58b0);
    }
    else {
      local_288 = local_270 + 1;
      local_289 = 0;
      local_28a = 0;
      local_290 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"",&local_2b1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      for (; local_288 <= local_278; local_288 = local_288 + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if (*pcVar3 == '<') {
          local_290 = local_290 + 1;
        }
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if (*pcVar3 == ' ') {
          local_289 = 0;
        }
        else {
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::__cxx11::string::operator[](in_RDI + 0x518);
          if (((__rhs->_M_dataplus == (_Alloc_hider)0x2c) ||
              (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar4 == '>'))
             || (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar4 == '='))
          {
            local_289 = 0;
            uVar5 = std::__cxx11::string::empty();
            if (((uVar5 & 1) == 0) && ((local_28a & 1) == 0)) {
              uVar1 = kwssys::RegularExpression::find
                                (in_stack_fffffffffffffc30,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
              withoutComments = (undefined1)((ulong)in_stack_fffffffffffffc48 >> 0x38);
              if ((!(bool)uVar1) && (local_290 == 0)) {
                ErrorStruct::ErrorStruct((ErrorStruct *)0x1b22eb);
                in_stack_fffffffffffffc50 =
                     GetLineNumber((Parser *)CONCAT17(uVar1,in_stack_fffffffffffffc58),
                                   in_stack_fffffffffffffc50,(bool)withoutComments);
                local_2e0 = 0x16;
                local_2f0 = in_stack_fffffffffffffc50;
                local_2e8 = in_stack_fffffffffffffc50;
                std::operator+(pcVar3,__rhs);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
                in_stack_fffffffffffffc48 = local_310;
                std::__cxx11::string::operator=(local_2d8,in_stack_fffffffffffffc48);
                std::__cxx11::string::~string(in_stack_fffffffffffffc48);
                std::__cxx11::string::~string(local_330);
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                local_241 = 1;
                ErrorStruct::~ErrorStruct((ErrorStruct *)0x1b23ce);
              }
            }
            in_stack_fffffffffffffc40 =
                 (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                 std::__cxx11::string::operator[](in_RDI + 0x518);
            local_28a = *(char *)&(in_stack_fffffffffffffc40->
                                  super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                  )._M_impl.super__Vector_impl_data._M_start == '=';
          }
          else {
            if ((local_289 & 1) == 0) {
              std::__cxx11::string::operator=(local_2b0,"");
            }
            in_stack_fffffffffffffc38 =
                 (value_type *)std::__cxx11::string::operator[](in_RDI + 0x518);
            std::__cxx11::string::operator+=
                      (local_2b0,(char)*(_Alloc_hider *)&in_stack_fffffffffffffc38->line);
            local_289 = 1;
          }
        }
        in_stack_fffffffffffffc30 =
             (RegularExpression *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if (*(char *)(in_stack_fffffffffffffc30->regmatch).startp == '>') {
          local_290 = local_290 + -1;
        }
      }
      local_250 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e58b0);
      std::__cxx11::string::~string(local_2b0);
    }
  } while( true );
}

Assistant:

bool Parser::CheckTemplate(const char* regEx)
{
  m_TestsDone[TEMPLATE] = true;
  m_TestsDescription[TEMPLATE] = "Template should match the regex: ";
  m_TestsDescription[TEMPLATE] += regEx;

  kwssys::RegularExpression regex(regEx);

  bool hasErrors = false;
  // We check all the templates in the file
  // Maybe we should separate the main class from the templated function
  // at some point.

  auto templatePos =
      static_cast<long int>(m_BufferNoComment.find("template", 0));
  while(templatePos != -1 ) 
    {
    bool valid = true;

    if(m_BufferNoComment[templatePos-1]!=' ' 
      && m_BufferNoComment[templatePos-1]!='\n')
      {
      valid = false;
      }
    else if(m_BufferNoComment[templatePos+8]!=' ' 
         && m_BufferNoComment[templatePos+8]!='\n')
      {
      valid = false;
      }

    // Definition is template <whatever name,whatever name2 = test, ...>
      auto inf =
          static_cast<long int>(m_BufferNoComment.find("<", templatePos));
      auto sup = static_cast<long int>(m_BufferNoComment.find(">", inf));

      if (inf == -1 || sup == -1) {
        // std::cout << "CheckTemplate(): There is a problem parsing the file"
        // << std::endl;
        valid = false;
      }
    else
      {
      for(long int p=templatePos+8;p<inf;p++)
        {
        if(m_BufferNoComment[p]!=' ' && m_BufferNoComment[p]!='\n'
           && m_BufferNoComment[p]!='\r')
          {
          valid = false;
          break;
          }
        }
      }



    if(!valid)
      {
      templatePos = static_cast<long int>(m_BufferNoComment.find("template",templatePos+1));
      continue;
      }

    long int i = inf+1;
    bool inWord = false;
    bool afterEqual = false;
    int level = 0;
    std::string currentWord = "";

    while(i<=sup)
      {
      if(m_BufferNoComment[i] == '<')
        {
        level++;
        }

      // If we have a space
      if(m_BufferNoComment[i] == ' ')
        {
        // do nothing
        inWord = false;
        }
      else if(m_BufferNoComment[i] == ',' || m_BufferNoComment[i] == '>' || m_BufferNoComment[i] == '=')
        {
        inWord = false;

        if (!currentWord.empty() && !afterEqual && !regex.find(currentWord) &&
            level == 0) {
          Error error;
          error.line = this->GetLineNumber(i,true);
          error.line2 = error.line;
          error.number = TEMPLATE;
          error.description = "Template definition (" + currentWord + ") doesn't match regular expression";
          m_ErrorList.push_back(error);
          hasErrors = true;
        }

        if(m_BufferNoComment[i] == '=')
          {
          afterEqual = true;
          }
        else
          {
          afterEqual = false;
          }
        }
      else
        {
        if(!inWord)
          {
          currentWord = "";
          }
        currentWord += m_BufferNoComment[i];
        inWord = true;
        }

       if(m_BufferNoComment[i] == '>')
        {
        level--;
        }
      i++;
      }

    templatePos = static_cast<long int>(m_BufferNoComment.find("template",templatePos+1));  
    }

  return !hasErrors;
}